

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::CreateTexture::CreateTexture
          (CreateTexture *this,SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,bool useSync,
          bool serverSync)

{
  Texture *this_00;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> local_58;
  SharedPtr<tcu::ThreadUtil::Event> local_48;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> local_38;
  
  Operation::Operation(&this->super_Operation,"CreateTexture",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__CreateTexture_01e00348;
  (this->m_texture).m_ptr = (Texture *)0x0;
  (this->m_texture).m_state = (SharedPtrStateBase *)0x0;
  this_00 = (Texture *)operator_new(0x78);
  local_48.m_ptr = (this->super_Operation).super_Operation.m_event.m_ptr;
  local_48.m_state = (this->super_Operation).super_Operation.m_event.m_state;
  if (local_48.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_48.m_state)->strongRefCount = (local_48.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_48.m_state)->weakRefCount = (local_48.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  local_58.m_ptr = (this->super_Operation).m_sync.m_ptr;
  local_58.m_state = (this->super_Operation).m_sync.m_state;
  if (local_58.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_58.m_state)->strongRefCount = (local_58.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_58.m_state)->weakRefCount = (local_58.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::Texture::Texture(this_00,&local_48,&local_58);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr(&local_38,this_00);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator=(texture,&local_38);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::release(&local_38);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::release(&local_58);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_48);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator=(&this->m_texture,texture);
  return;
}

Assistant:

CreateTexture::CreateTexture (SharedPtr<Texture>& texture, bool useSync, bool serverSync)
	: Operation	("CreateTexture", useSync, serverSync)
{
	texture = SharedPtr<Texture>(new Texture(getEvent(), getSync()));
	m_texture = texture;
}